

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

void x86TestEncoding(uchar *codeLaunchHeader)

{
  undefined8 *puVar1;
  int iVar2;
  uchar *stream;
  x86Instruction *start;
  long lVar3;
  ulong uVar4;
  uchar *code;
  uchar *puVar5;
  ulong uVar6;
  uint uVar7;
  uchar *puVar8;
  OutputContext output;
  char instBuf [128];
  CodeGenRegVmStateContext vmState;
  CodeGenGenericContext ctx;
  
  stream = (uchar *)operator_new__(0x200000);
  CodeGenGenericContext::CodeGenGenericContext(&ctx);
  start = (x86Instruction *)operator_new__(0x1400000);
  lVar3 = 0;
  do {
    *(undefined4 *)((long)&start->name + lVar3) = 0;
    *(undefined4 *)((long)&(start->argA).type + lVar3) = 0;
    puVar1 = (undefined8 *)((long)&(start->argB).field_1 + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&(start->argB).ptrMult + lVar3) = 0;
    puVar1 = (undefined8 *)((long)&(start->argA).field_1 + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(start->argA).ptrIndex + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x50;
  } while (lVar3 != 0x1400000);
  NULLC::fillMemory(start,0,0x1400000);
  ctx.x86Op = start;
  ctx.x86Base = start;
  iVar2 = TestRptrXmmEncoding(&ctx,stream,o_movss,x86MOVSS,1);
  puVar8 = stream + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_movsd,x86MOVSD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrXmmEncoding(&ctx,puVar8,o_movsd,x86MOVSD,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRptrEncoding(&ctx,puVar8,o_movsd,x86MOVSD,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegXmmEncoding(&ctx,puVar8,o_movd,x86MOVD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_movsxd,x86MOVSXD,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRptrEncoding(&ctx,puVar8,o_cvtss2sd,x86CVTSS2SD,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_cvtss2sd,x86CVTSS2SD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRptrEncoding(&ctx,puVar8,o_cvtsd2ss,x86CVTSD2SS,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_cvtsd2ss,x86CVTSD2SS);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_cvttsd2si,x86CVTTSD2SI,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_cvttsd2si64,x64CVTTSD2SI,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRptrEncoding(&ctx,puVar8,o_cvtsi2sd,x86CVTSI2SD,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRegEncoding(&ctx,puVar8,o_cvtsi2sd,x86CVTSI2SD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRegEncoding(&ctx,puVar8,o_cvtsi2sd64,x64CVTSI2SD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_addsd,x86ADDSD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRptrEncoding(&ctx,puVar8,o_addsd,x86ADDSD,3);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_subsd,x86SUBSD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRptrEncoding(&ctx,puVar8,o_subsd,x86SUBSD,3);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_mulsd,x86MULSD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRptrEncoding(&ctx,puVar8,o_mulsd,x86MULSD,3);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_divsd,x86DIVSD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmRptrEncoding(&ctx,puVar8,o_divsd,x86DIVSD,3);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_sqrtsd,x86SQRTSD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_cmpeqsd,x86CMPEQSD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_cmpltsd,x86CMPLTSD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_cmplesd,x86CMPLESD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestXmmXmmEncoding(&ctx,puVar8,o_cmpneqsd,x86CMPNEQSD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrEncoding(&ctx,puVar8,o_push,x86PUSH,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_push,x86PUSH);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestNumEncoding(&ctx,puVar8,o_push,x86PUSH);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrEncoding(&ctx,puVar8,o_pop,x86POP,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_pop,x86POP);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_mov,x86MOV,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_mov,x86MOV);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_mov,x86MOV,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_mov,x86MOV,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_mov,x86MOV,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNum64Encoding(&ctx,puVar8,o_mov64,x64MOV);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_mov64,x64MOV);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_mov64,x86MOV,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_mov64,x86MOV,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_mov64,x86MOV,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_lea,x86LEA,3);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrEncoding(&ctx,puVar8,o_neg,x86NEG,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_neg,x86NEG);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrEncoding(&ctx,puVar8,o_neg64,x86NEG,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_neg64,x64NEG);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_add,x86ADD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_add,x86ADD,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_add,x86ADD,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_add,x86ADD,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_add,x86ADD,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_add64,x64ADD);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_add64,x64ADD,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_add64,x86ADD,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_add64,x86ADD,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_add64,x86ADD,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_adc,x86ADC);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_adc,x86ADC,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_adc,x86ADC,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_adc,x86ADC,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_sub,x86SUB);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_sub,x86SUB,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_sub,x86SUB,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_sub,x86SUB,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_sub64,x64SUB);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_sub64,x64SUB,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_sub64,x86SUB,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_sub64,x86SUB,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_sbb,x86SBB,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_sbb,x86SBB);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_sbb,x86SBB,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_sbb,x86SBB,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_imul,x86IMUL);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_imul,x86IMUL);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_imul,x86IMUL,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_imul,x86IMUL,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_imul64,x64IMUL);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_imul64,x86IMUL,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrEncoding(&ctx,puVar8,o_idiv,x86IDIV,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_idiv,x86IDIV);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrEncoding(&ctx,puVar8,o_idiv64,x86IDIV,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_idiv64,x64IDIV);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_shl,x86SHL,true);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_shl,x86SHL,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_sal,x86SAL);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_sal,x86SAL,true);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_sal64,x64SAL);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_sal64,x64SAL,true);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_sar,x86SAR);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_sar,x86SAR,true);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_sar64,x64SAR);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_sar64,x64SAR,true);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrEncoding(&ctx,puVar8,o_not,x86NOT,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_not,x86NOT);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrEncoding(&ctx,puVar8,o_not64,x86NOT,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_not64,x64NOT);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_and,x86AND);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_and,x86AND,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_and,x86AND,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_and,x86AND,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_and,x86AND,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_and64,x64AND);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_and64,x86AND,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_and64,x86AND,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_and64,x86AND,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_or,x86OR);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_or,x86OR,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_or,x86OR,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_or,x86OR,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_or,x86OR,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_or64,x64OR);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_or64,x86OR,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_or64,x86OR,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_or64,x86OR,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_xor,x86XOR);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_xor,x86XOR,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_xor,x86XOR,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_xor,x86XOR,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_xor,x86XOR,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_xor64,x64XOR);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_xor64,x86XOR,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_xor64,x86XOR,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_xor64,x86XOR,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_cmp,x86CMP);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_cmp,x86CMP,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_cmp,x86CMP,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_cmp,x86CMP,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_cmp,x86CMP,1);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_cmp64,x64CMP);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegNumEncoding(&ctx,puVar8,o_cmp64,x64CMP,false);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRptrEncoding(&ctx,puVar8,o_cmp64,x86CMP,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrRegEncoding(&ctx,puVar8,o_cmp64,x86CMP,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrNumEncoding(&ctx,puVar8,o_cmp64,x86CMP,2);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegRegEncoding(&ctx,puVar8,o_test,x86TEST);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRegEncoding(&ctx,puVar8,o_call,x86CALL);
  puVar8 = puVar8 + iVar2;
  iVar2 = TestRptrEncoding(&ctx,puVar8,o_call,x86CALL,2);
  if (stream + 0x200000 <= puVar8 + iVar2) {
    __assert_fail("stream < buf + bufSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x1044,"void x86TestEncoding(unsigned char *)");
  }
  uVar4 = ((long)ctx.x86Op - (long)start) / 0x50;
  memset(&vmState.ctx,0,0x8c);
  vmState.tempStackArrayBase = (uint *)0x0;
  vmState.tempStackArrayEnd = (uint *)0x0;
  vmState.callInstructionPos = 0;
  memset(&vmState.instAddress,0,0x9a);
  output.outputBuf = output.outputBufDef;
  output.outputBufSize = 0x100;
  output.outputBufPos = 0;
  output.tempBuf = output.tempBufDef;
  output.tempBufSize = 0x100;
  output.stream = (void *)0x0;
  vmState.vsAsmStyle = true;
  output.openStream = OutputContext::FileOpen;
  output.writeStream = OutputContext::FileWrite;
  output.closeStream = OutputContext::FileClose;
  output.stream = OutputContext::FileOpen("asmX86_test.txt");
  for (lVar3 = 0; (uVar4 & 0xffffffff) * 0x50 - lVar3 != 0; lVar3 = lVar3 + 0x50) {
    x86Instruction::Decode((x86Instruction *)((long)&start->name + lVar3),&vmState,instBuf,0x80);
    OutputContext::Print(&output,instBuf);
    uVar6 = (ulong)output.outputBufPos;
    uVar7 = output.outputBufPos + 1;
    output.outputBufPos = uVar7;
    output.outputBuf[uVar6] = '\n';
    if (uVar7 == output.outputBufSize) {
      (*output.writeStream)(output.stream,output.outputBuf,uVar7);
      output._264_8_ = output._264_8_ & 0xffffffff;
    }
  }
  if (output.outputBufPos != 0) {
    (*output.writeStream)(output.stream,output.outputBuf,output.outputBufPos);
  }
  output._264_8_ = output._264_8_ & 0xffffffff;
  (*output.closeStream)(output.stream);
  output.stream = (void *)0x0;
  code = (uchar *)operator_new__(0x200000);
  puVar5 = x86TranslateInstructionList(code,code + 0x200000,start,(uint)uVar4,(uchar **)0x0);
  uVar7 = (int)(puVar8 + iVar2) - (int)stream;
  if ((int)puVar5 - (int)code != uVar7) {
    __assert_fail("unsigned(stream2 - buf2) == unsigned(stream - buf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x1062,"void x86TestEncoding(unsigned char *)");
  }
  iVar2 = bcmp(stream,code,(ulong)uVar7);
  if (iVar2 != 0) {
    __assert_fail("memcmp(buf, buf2, unsigned(stream - buf)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x1065,"void x86TestEncoding(unsigned char *)");
  }
  OutputContext::~OutputContext(&output);
  return;
}

Assistant:

void x86TestEncoding(unsigned char *codeLaunchHeader)
{
	(void)codeLaunchHeader;

	// clang takes an extreemely long time to optimize this function
#if !defined(NDEBUG)
	unsigned bufSize = 2048 * 1024;
	unsigned char *buf = new unsigned char[bufSize];

	CodeGenGenericContext ctx;
	unsigned char *stream = buf;

	unsigned instSize = 256 * 1024;
	x86Instruction *instList = new x86Instruction[instSize];
	NULLC::fillMemory(instList, 0, instSize * sizeof(x86Instruction));
	ctx.SetLastInstruction(instList, instList);

	stream += TestRptrXmmEncoding(ctx, stream, o_movss, x86MOVSS, testSizeDword);

	stream += TestXmmXmmEncoding(ctx, stream, o_movsd, x86MOVSD);
	stream += TestRptrXmmEncoding(ctx, stream, o_movsd, x86MOVSD, testSizeQword);
	stream += TestXmmRptrEncoding(ctx, stream, o_movsd, x86MOVSD, testSizeQword);

	stream += TestRegXmmEncoding(ctx, stream, o_movd, x86MOVD);

	stream += TestRegRptrEncoding(ctx, stream, o_movsxd, x86MOVSXD, testSizeDword);

	stream += TestXmmRptrEncoding(ctx, stream, o_cvtss2sd, x86CVTSS2SD, testSizeDword);
	stream += TestXmmXmmEncoding(ctx, stream, o_cvtss2sd, x86CVTSS2SD);

	stream += TestXmmRptrEncoding(ctx, stream, o_cvtsd2ss, x86CVTSD2SS, testSizeQword);
	stream += TestXmmXmmEncoding(ctx, stream, o_cvtsd2ss, x86CVTSD2SS);

	stream += TestRegRptrEncoding(ctx, stream, o_cvttsd2si, x86CVTTSD2SI, testSizeQword);

	stream += TestRegRptrEncoding(ctx, stream, o_cvttsd2si64, x64CVTTSD2SI, testSizeQword);

	stream += TestXmmRptrEncoding(ctx, stream, o_cvtsi2sd, x86CVTSI2SD, testSizeDword);
	stream += TestXmmRegEncoding(ctx, stream, o_cvtsi2sd, x86CVTSI2SD);
	stream += TestXmmRegEncoding(ctx, stream, o_cvtsi2sd64, x64CVTSI2SD);

	stream += TestXmmXmmEncoding(ctx, stream, o_addsd, x86ADDSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_addsd, x86ADDSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_subsd, x86SUBSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_subsd, x86SUBSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_mulsd, x86MULSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_mulsd, x86MULSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_divsd, x86DIVSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_divsd, x86DIVSD);

	stream += TestXmmXmmEncoding(ctx, stream, o_sqrtsd, x86SQRTSD);

	stream += TestXmmXmmEncoding(ctx, stream, o_cmpeqsd, x86CMPEQSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_cmpltsd, x86CMPLTSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_cmplesd, x86CMPLESD);
	stream += TestXmmXmmEncoding(ctx, stream, o_cmpneqsd, x86CMPNEQSD);

#if defined(_M_X64)
	stream += TestRptrEncoding(ctx, stream, o_push, x86PUSH, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_push, x86PUSH);
	stream += TestNumEncoding(ctx, stream, o_push, x86PUSH);

	stream += TestRptrEncoding(ctx, stream, o_pop, x86POP, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_pop, x86POP);
#else
	stream += TestRptrEncoding(ctx, stream, o_push, x86PUSH, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_push, x86PUSH);
	stream += TestNumEncoding(ctx, stream, o_push, x86PUSH);

	stream += TestRptrEncoding(ctx, stream, o_pop, x86POP, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_pop, x86POP);
#endif

	stream += TestRegNumEncoding(ctx, stream, o_mov, x86MOV);
	stream += TestRegRegEncoding(ctx, stream, o_mov, x86MOV);
	stream += TestRegRptrEncoding(ctx, stream, o_mov, x86MOV, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_mov, x86MOV, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_mov, x86MOV, testSizeDword);

	stream += TestRegNum64Encoding(ctx, stream, o_mov64, x64MOV);
	stream += TestRegRegEncoding(ctx, stream, o_mov64, x64MOV);
	stream += TestRegRptrEncoding(ctx, stream, o_mov64, x86MOV, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_mov64, x86MOV, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_mov64, x86MOV, testSizeQword);

	//stream += TestRegRptrEncoding(ctx, stream, o_movsx, x86MOVSX);

	stream += TestRegRptrEncoding(ctx, stream, o_lea, x86LEA);

	stream += TestRptrEncoding(ctx, stream, o_neg, x86NEG, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_neg, x86NEG);

	stream += TestRptrEncoding(ctx, stream, o_neg64, x86NEG, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_neg64, x64NEG);

	stream += TestRegRegEncoding(ctx, stream, o_add, x86ADD);
	stream += TestRegNumEncoding(ctx, stream, o_add, x86ADD);
	stream += TestRegRptrEncoding(ctx, stream, o_add, x86ADD, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_add, x86ADD, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_add, x86ADD, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_add64, x64ADD);
	stream += TestRegNumEncoding(ctx, stream, o_add64, x64ADD);
	stream += TestRegRptrEncoding(ctx, stream, o_add64, x86ADD, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_add64, x86ADD, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_add64, x86ADD, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_adc, x86ADC);
	stream += TestRegNumEncoding(ctx, stream, o_adc, x86ADC);
	stream += TestRptrRegEncoding(ctx, stream, o_adc, x86ADC, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_adc, x86ADC, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_sub, x86SUB);
	stream += TestRegNumEncoding(ctx, stream, o_sub, x86SUB);
	stream += TestRptrRegEncoding(ctx, stream, o_sub, x86SUB, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_sub, x86SUB, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_sub64, x64SUB);
	stream += TestRegNumEncoding(ctx, stream, o_sub64, x64SUB);
	stream += TestRptrRegEncoding(ctx, stream, o_sub64, x86SUB, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_sub64, x86SUB, testSizeQword);

	stream += TestRegNumEncoding(ctx, stream, o_sbb, x86SBB);
	stream += TestRegRegEncoding(ctx, stream, o_sbb, x86SBB);
	stream += TestRptrRegEncoding(ctx, stream, o_sbb, x86SBB, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_sbb, x86SBB, testSizeDword);

	stream += TestRegEncoding(ctx, stream, o_imul, x86IMUL);
	stream += TestRegRegEncoding(ctx, stream, o_imul, x86IMUL);
	stream += TestRegNumEncoding(ctx, stream, o_imul, x86IMUL);
	stream += TestRegRptrEncoding(ctx, stream, o_imul, x86IMUL, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_imul64, x64IMUL);
	stream += TestRegRptrEncoding(ctx, stream, o_imul64, x86IMUL, testSizeQword);

	stream += TestRptrEncoding(ctx, stream, o_idiv, x86IDIV, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_idiv, x86IDIV);

	stream += TestRptrEncoding(ctx, stream, o_idiv64, x86IDIV, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_idiv64, x64IDIV);

	stream += TestRegNumEncoding(ctx, stream, o_shl, x86SHL, true);
	stream += TestRptrNumEncoding(ctx, stream, o_shl, x86SHL, testSizeDword);

	stream += TestRegEncoding(ctx, stream, o_sal, x86SAL);
	stream += TestRegNumEncoding(ctx, stream, o_sal, x86SAL, true);

	stream += TestRegEncoding(ctx, stream, o_sal64, x64SAL);
	stream += TestRegNumEncoding(ctx, stream, o_sal64, x64SAL, true);

	stream += TestRegEncoding(ctx, stream, o_sar, x86SAR);
	stream += TestRegNumEncoding(ctx, stream, o_sar, x86SAR, true);

	stream += TestRegEncoding(ctx, stream, o_sar64, x64SAR);
	stream += TestRegNumEncoding(ctx, stream, o_sar64, x64SAR, true);

	stream += TestRptrEncoding(ctx, stream, o_not, x86NOT, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_not, x86NOT);

	stream += TestRptrEncoding(ctx, stream, o_not64, x86NOT, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_not64, x64NOT);

	stream += TestRegRegEncoding(ctx, stream, o_and, x86AND);
	stream += TestRegNumEncoding(ctx, stream, o_and, x86AND);
	stream += TestRegRptrEncoding(ctx, stream, o_and, x86AND, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_and, x86AND, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_and, x86AND, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_and64, x64AND);
	stream += TestRegRptrEncoding(ctx, stream, o_and64, x86AND, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_and64, x86AND, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_and64, x86AND, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_or, x86OR);
	stream += TestRegNumEncoding(ctx, stream, o_or, x86OR);
	stream += TestRegRptrEncoding(ctx, stream, o_or, x86OR, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_or, x86OR, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_or, x86OR, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_or64, x64OR);
	stream += TestRegRptrEncoding(ctx, stream, o_or64, x86OR, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_or64, x86OR, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_or64, x86OR, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_xor, x86XOR);
	stream += TestRegNumEncoding(ctx, stream, o_xor, x86XOR);
	stream += TestRegRptrEncoding(ctx, stream, o_xor, x86XOR, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_xor, x86XOR, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_xor, x86XOR, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_xor64, x64XOR);
	stream += TestRegRptrEncoding(ctx, stream, o_xor64, x86XOR, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_xor64, x86XOR, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_xor64, x86XOR, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_cmp, x86CMP);
	stream += TestRegNumEncoding(ctx, stream, o_cmp, x86CMP);
	stream += TestRegRptrEncoding(ctx, stream, o_cmp, x86CMP, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_cmp, x86CMP, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_cmp, x86CMP, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_cmp64, x64CMP);
	stream += TestRegNumEncoding(ctx, stream, o_cmp64, x64CMP);
	stream += TestRegRptrEncoding(ctx, stream, o_cmp64, x86CMP, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_cmp64, x86CMP, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_cmp64, x86CMP, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_test, x86TEST);

	stream += TestRegEncoding(ctx, stream, o_call, x86CALL);
	stream += TestRptrEncoding(ctx, stream, o_call, x86CALL, testSizeQword);

	assert(stream < buf + bufSize);

	const unsigned instBufSize = 128;
	char instBuf[instBufSize];

	unsigned instCount = unsigned(ctx.GetLastInstruction() - instList);

	CodeGenRegVmStateContext vmState;

	vmState.vsAsmStyle = true;

	OutputContext output;
	output.stream = output.openStream("asmX86_test.txt");

	for(unsigned i = 0; i < instCount; i++)
	{
		instList[i].Decode(vmState, instBuf, instBufSize);

		output.Print(instBuf);
		output.Print('\n');
	}

	output.Flush();
	output.closeStream(output.stream);
	output.stream = NULL;

	unsigned char *buf2 = new unsigned char[bufSize];

	unsigned char *stream2 = x86TranslateInstructionList(buf2, buf2 + bufSize, instList, instCount, NULL);

	assert(unsigned(stream2 - buf2) == unsigned(stream - buf));
	(void)stream2;

	assert(memcmp(buf, buf2, unsigned(stream - buf)) == 0);

	/*DWORD oldProtect;
	VirtualProtect((void*)buf, unsigned(stream - buf), PAGE_EXECUTE_READWRITE, (DWORD*)&oldProtect);

	uintptr_t regFilePtr[8];

	typedef	uintptr_t(*nullcFunc)(unsigned char *codeStart, uintptr_t *regFilePtr);
	nullcFunc gate = (nullcFunc)(uintptr_t)codeLaunchHeader;
	gate(buf, regFilePtr);*/
#endif
}